

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

FindInfo absl::lts_20240722::container_internal::find_first_non_full<void>
                   (CommonFields *common,size_t hash)

{
  ctrl_t *pcVar1;
  ctrl_t *ctrl;
  ushort uVar2;
  ushort x;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  undefined1 auVar9 [11];
  undefined1 auVar10 [12];
  undefined1 auVar11 [13];
  undefined1 auVar12 [14];
  bool bVar13;
  uint uVar14;
  ulong uVar15;
  char in_XMM1_Ba;
  char in_XMM1_Bb;
  char in_XMM1_Bc;
  char in_XMM1_Bd;
  char in_XMM1_Be;
  char in_XMM1_Bf;
  char in_XMM1_Bg;
  char in_XMM1_Bh;
  char in_XMM1_Bi;
  char in_XMM1_Bj;
  char in_XMM1_Bk;
  char in_XMM1_Bl;
  char in_XMM1_Bm;
  char in_XMM1_Bn;
  char in_XMM1_Bo;
  byte in_XMM1_Bp;
  FindInfo FVar16;
  probe_seq<16UL> seq;
  probe_seq<16UL> local_40;
  
  probe(&local_40,common,hash);
  ctrl = (common->heap_or_soo_).heap.control;
  if (ctrl[local_40.offset_] < kSentinel) {
    bVar13 = ShouldInsertBackwardsForDebug(common->capacity_,hash,ctrl);
    if (!bVar13) {
      local_40.index_ = 0;
      goto LAB_00103ec1;
    }
  }
  while( true ) {
    uVar15 = local_40.index_ + 0x10;
    pcVar1 = ctrl + local_40.offset_;
    iVar5 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))) ==
                   CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))));
    iVar6 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))) ==
                   CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))));
    iVar7 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))) ==
                   CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))));
    iVar8 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))) ==
                   CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))));
    in_XMM1_Ba = -(*pcVar1 < (ctrl_t)iVar5);
    in_XMM1_Bb = -(pcVar1[1] < (ctrl_t)((uint)iVar5 >> 8));
    in_XMM1_Bc = -(pcVar1[2] < (ctrl_t)((uint)iVar5 >> 0x10));
    in_XMM1_Bd = -(pcVar1[3] < (ctrl_t)((uint)iVar5 >> 0x18));
    in_XMM1_Be = -(pcVar1[4] < (ctrl_t)iVar6);
    in_XMM1_Bf = -(pcVar1[5] < (ctrl_t)((uint)iVar6 >> 8));
    in_XMM1_Bg = -(pcVar1[6] < (ctrl_t)((uint)iVar6 >> 0x10));
    in_XMM1_Bh = -(pcVar1[7] < (ctrl_t)((uint)iVar6 >> 0x18));
    in_XMM1_Bi = -(pcVar1[8] < (ctrl_t)iVar7);
    in_XMM1_Bj = -(pcVar1[9] < (ctrl_t)((uint)iVar7 >> 8));
    in_XMM1_Bk = -(pcVar1[10] < (ctrl_t)((uint)iVar7 >> 0x10));
    in_XMM1_Bl = -(pcVar1[0xb] < (ctrl_t)((uint)iVar7 >> 0x18));
    in_XMM1_Bm = -(pcVar1[0xc] < (ctrl_t)iVar8);
    in_XMM1_Bn = -(pcVar1[0xd] < (ctrl_t)((uint)iVar8 >> 8));
    in_XMM1_Bo = -(pcVar1[0xe] < (ctrl_t)((uint)iVar8 >> 0x10));
    in_XMM1_Bp = -(pcVar1[0xf] < (ctrl_t)((uint)iVar8 >> 0x18));
    auVar3[1] = in_XMM1_Bb;
    auVar3[0] = in_XMM1_Ba;
    auVar3[2] = in_XMM1_Bc;
    auVar3[3] = in_XMM1_Bd;
    auVar3[4] = in_XMM1_Be;
    auVar3[5] = in_XMM1_Bf;
    auVar3[6] = in_XMM1_Bg;
    auVar3[7] = in_XMM1_Bh;
    auVar3[8] = in_XMM1_Bi;
    auVar3[9] = in_XMM1_Bj;
    auVar3[10] = in_XMM1_Bk;
    auVar3[0xb] = in_XMM1_Bl;
    auVar3[0xc] = in_XMM1_Bm;
    auVar3[0xd] = in_XMM1_Bn;
    auVar3[0xe] = in_XMM1_Bo;
    auVar3[0xf] = in_XMM1_Bp;
    auVar4[1] = in_XMM1_Bb;
    auVar4[0] = in_XMM1_Ba;
    auVar4[2] = in_XMM1_Bc;
    auVar4[3] = in_XMM1_Bd;
    auVar4[4] = in_XMM1_Be;
    auVar4[5] = in_XMM1_Bf;
    auVar4[6] = in_XMM1_Bg;
    auVar4[7] = in_XMM1_Bh;
    auVar4[8] = in_XMM1_Bi;
    auVar4[9] = in_XMM1_Bj;
    auVar4[10] = in_XMM1_Bk;
    auVar4[0xb] = in_XMM1_Bl;
    auVar4[0xc] = in_XMM1_Bm;
    auVar4[0xd] = in_XMM1_Bn;
    auVar4[0xe] = in_XMM1_Bo;
    auVar4[0xf] = in_XMM1_Bp;
    auVar12[1] = in_XMM1_Bd;
    auVar12[0] = in_XMM1_Bc;
    auVar12[2] = in_XMM1_Be;
    auVar12[3] = in_XMM1_Bf;
    auVar12[4] = in_XMM1_Bg;
    auVar12[5] = in_XMM1_Bh;
    auVar12[6] = in_XMM1_Bi;
    auVar12[7] = in_XMM1_Bj;
    auVar12[8] = in_XMM1_Bk;
    auVar12[9] = in_XMM1_Bl;
    auVar12[10] = in_XMM1_Bm;
    auVar12[0xb] = in_XMM1_Bn;
    auVar12[0xc] = in_XMM1_Bo;
    auVar12[0xd] = in_XMM1_Bp;
    auVar11[1] = in_XMM1_Be;
    auVar11[0] = in_XMM1_Bd;
    auVar11[2] = in_XMM1_Bf;
    auVar11[3] = in_XMM1_Bg;
    auVar11[4] = in_XMM1_Bh;
    auVar11[5] = in_XMM1_Bi;
    auVar11[6] = in_XMM1_Bj;
    auVar11[7] = in_XMM1_Bk;
    auVar11[8] = in_XMM1_Bl;
    auVar11[9] = in_XMM1_Bm;
    auVar11[10] = in_XMM1_Bn;
    auVar11[0xb] = in_XMM1_Bo;
    auVar11[0xc] = in_XMM1_Bp;
    auVar10[1] = in_XMM1_Bf;
    auVar10[0] = in_XMM1_Be;
    auVar10[2] = in_XMM1_Bg;
    auVar10[3] = in_XMM1_Bh;
    auVar10[4] = in_XMM1_Bi;
    auVar10[5] = in_XMM1_Bj;
    auVar10[6] = in_XMM1_Bk;
    auVar10[7] = in_XMM1_Bl;
    auVar10[8] = in_XMM1_Bm;
    auVar10[9] = in_XMM1_Bn;
    auVar10[10] = in_XMM1_Bo;
    auVar10[0xb] = in_XMM1_Bp;
    auVar9[1] = in_XMM1_Bg;
    auVar9[0] = in_XMM1_Bf;
    auVar9[2] = in_XMM1_Bh;
    auVar9[3] = in_XMM1_Bi;
    auVar9[4] = in_XMM1_Bj;
    auVar9[5] = in_XMM1_Bk;
    auVar9[6] = in_XMM1_Bl;
    auVar9[7] = in_XMM1_Bm;
    auVar9[8] = in_XMM1_Bn;
    auVar9[9] = in_XMM1_Bo;
    auVar9[10] = in_XMM1_Bp;
    x = (ushort)(SUB161(auVar3 >> 7,0) & 1) | (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
        (ushort)(SUB141(auVar12 >> 7,0) & 1) << 2 | (ushort)(SUB131(auVar11 >> 7,0) & 1) << 3 |
        (ushort)(SUB121(auVar10 >> 7,0) & 1) << 4 | (ushort)(SUB111(auVar9 >> 7,0) & 1) << 5 |
        (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                 CONCAT18(in_XMM1_Bo,
                                          CONCAT17(in_XMM1_Bn,
                                                   CONCAT16(in_XMM1_Bm,
                                                            CONCAT15(in_XMM1_Bl,
                                                                     CONCAT14(in_XMM1_Bk,
                                                                              CONCAT13(in_XMM1_Bj,
                                                                                       CONCAT12(
                                                  in_XMM1_Bi,CONCAT11(in_XMM1_Bh,in_XMM1_Bg)))))))))
                       >> 7) & 1) << 6 |
        (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                 CONCAT17(in_XMM1_Bo,
                                          CONCAT16(in_XMM1_Bn,
                                                   CONCAT15(in_XMM1_Bm,
                                                            CONCAT14(in_XMM1_Bl,
                                                                     CONCAT13(in_XMM1_Bk,
                                                                              CONCAT12(in_XMM1_Bj,
                                                                                       CONCAT11(
                                                  in_XMM1_Bi,in_XMM1_Bh)))))))) >> 7) & 1) << 7 |
        (ushort)(in_XMM1_Bp >> 7) << 0xf;
    if (x != 0) break;
    local_40.offset_ = local_40.offset_ + uVar15 & local_40.mask_;
    local_40.index_ = uVar15;
    if (common->capacity_ < uVar15) {
      __assert_fail("seq.index() <= common.capacity() && \"full table!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0x6ec,
                    "FindInfo absl::container_internal::find_first_non_full(const CommonFields &, size_t)"
                   );
    }
  }
  bVar13 = ShouldInsertBackwardsForDebug(common->capacity_,hash,ctrl);
  if (bVar13) {
    uVar2 = 0xf;
    if (x != 0) {
      for (; x >> uVar2 == 0; uVar2 = uVar2 - 1) {
      }
    }
    uVar14 = (ushort)((uVar2 ^ 0xfff0) + 0x11) - 1;
  }
  else {
    uVar14 = TrailingZeros<unsigned_short>(x);
  }
  local_40.offset_ = uVar14 + local_40.offset_ & local_40.mask_;
LAB_00103ec1:
  FVar16.probe_length = local_40.index_;
  FVar16.offset = local_40.offset_;
  return FVar16;
}

Assistant:

inline FindInfo find_first_non_full(const CommonFields& common, size_t hash) {
  auto seq = probe(common, hash);
  const ctrl_t* ctrl = common.control();
  if (IsEmptyOrDeleted(ctrl[seq.offset()]) &&
      !ShouldInsertBackwards(common.capacity(), hash, ctrl)) {
    return {seq.offset(), /*probe_length=*/0};
  }
  while (true) {
    GroupFullEmptyOrDeleted g{ctrl + seq.offset()};
    auto mask = g.MaskEmptyOrDeleted();
    if (mask) {
      return {
          seq.offset(GetInsertionOffset(mask, common.capacity(), hash, ctrl)),
          seq.index()};
    }
    seq.next();
    assert(seq.index() <= common.capacity() && "full table!");
  }
}